

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_string.c
# Opt level: O1

ngx_int_t ngx_atoi(u_char *line,size_t n)

{
  byte bVar1;
  ngx_int_t nVar2;
  size_t sVar3;
  
  if (n == 0) {
LAB_001178da:
    nVar2 = -1;
  }
  else {
    sVar3 = 0;
    nVar2 = 0;
    do {
      bVar1 = line[sVar3];
      if (((byte)(bVar1 - 0x3a) < 0xf6) ||
         ((0xccccccccccccccb < nVar2 && ((nVar2 != 0xccccccccccccccc || ((bVar1 & 8) != 0))))))
      goto LAB_001178da;
      nVar2 = (ulong)bVar1 + nVar2 * 10 + -0x30;
      sVar3 = sVar3 + 1;
    } while (n != sVar3);
  }
  return nVar2;
}

Assistant:

ngx_int_t
ngx_atoi(u_char *line, size_t n)
{
    ngx_int_t  value, cutoff, cutlim;

    if (n == 0) {
        return NGX_ERROR;
    }

    cutoff = NGX_MAX_INT_T_VALUE / 10;
    cutlim = NGX_MAX_INT_T_VALUE % 10;

    for (value = 0; n--; line++) {
        if (*line < '0' || *line > '9') {
            return NGX_ERROR;
        }

        if (value >= cutoff && (value > cutoff || *line - '0' > cutlim)) {
            return NGX_ERROR;
        }

        value = value * 10 + (*line - '0');
    }

    return value;
}